

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::internal::StreamingListener::UrlEncode_abi_cxx11_
          (string *__return_storage_ptr__,StreamingListener *this,char *str)

{
  byte bVar1;
  ulong uVar2;
  long *plVar3;
  long *plVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar5;
  string local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  strlen((char *)this);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar5 = extraout_RDX;
  do {
    bVar1 = *(byte *)&(this->super_EmptyTestEventListener).super_TestEventListener.
                      _vptr_TestEventListener;
    uVar2 = (ulong)bVar1;
    if (uVar2 < 0x3e) {
      if ((0x2000006000000400U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 == 0) {
          return __return_storage_ptr__;
        }
        goto LAB_0012bc30;
      }
      String::FormatByte_abi_cxx11_(&local_78,(String *)(ulong)bVar1,(uchar)uVar5);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x1421a8);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_48 = *plVar4;
        lStack_40 = plVar3[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *plVar4;
        local_58 = (long *)*plVar3;
      }
      local_50 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58);
      uVar5 = extraout_RDX_00;
      if (local_58 != &local_48) {
        operator_delete(local_58);
        uVar5 = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
        uVar5 = extraout_RDX_02;
      }
    }
    else {
LAB_0012bc30:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar5 = extraout_RDX_03;
    }
    this = (StreamingListener *)
           ((long)&(this->super_EmptyTestEventListener).super_TestEventListener.
                   _vptr_TestEventListener + 1);
  } while( true );
}

Assistant:

string StreamingListener::UrlEncode(const char* str) {
  string result;
  result.reserve(strlen(str) + 1);
  for (char ch = *str; ch != '\0'; ch = *++str) {
    switch (ch) {
      case '%':
      case '=':
      case '&':
      case '\n':
        result.append("%" + String::FormatByte(static_cast<unsigned char>(ch)));
        break;
      default:
        result.push_back(ch);
        break;
    }
  }
  return result;
}